

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O1

void __thiscall FCELTexture::MakeTexture(FCELTexture *this)

{
  ushort uVar1;
  ushort uVar2;
  BYTE *src;
  BYTE BVar3;
  BYTE *dst;
  long lVar4;
  byte *pbVar5;
  BYTE palette [256];
  CELPalette celPalette;
  BYTE local_428 [255];
  undefined1 local_329;
  BYTE local_328 [2];
  byte local_326 [766];
  
  anon_unknown.dwarf_92b802::LoadCELLump
            ((this->super_FTexture).SourceLump,(CELPalette *)local_328,&this->m_pixels);
  pbVar5 = local_326;
  lVar4 = 0;
  do {
    BVar3 = FColorMatcher::Pick(&ColorMatcher,(uint)pbVar5[-2],(uint)pbVar5[-1],(uint)*pbVar5);
    local_428[lVar4] = BVar3;
    lVar4 = lVar4 + 1;
    pbVar5 = pbVar5 + 3;
  } while (lVar4 != 0xff);
  local_329 = 0;
  src = this->m_pixels;
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  dst = (BYTE *)operator_new__((ulong)uVar2 * (ulong)uVar1);
  this->m_pixels = dst;
  FTexture::FlipNonSquareBlockRemap(dst,src,(uint)uVar1,(uint)uVar2,(uint)uVar1,local_428);
  if (src != (BYTE *)0x0) {
    operator_delete__(src);
  }
  return;
}

Assistant:

void FCELTexture::MakeTexture()
{
	CELPalette celPalette;

	LoadCELLump(SourceLump, celPalette, m_pixels);

	BYTE palette[256];

	for (size_t i = 0; i < 255; ++i)
	{
		const BYTE* const color = &celPalette[3 * i];
		palette[i] = ColorMatcher.Pick(color[0], color[1], color[2]);
	}

	// The last palette entry is an alpha mask
	palette[255] = 0;

	const BYTE* const oldPixels = m_pixels;

	m_pixels = new BYTE[Width * Height];
	FlipNonSquareBlockRemap(m_pixels, oldPixels, Width, Height, Width, palette);

	delete[] oldPixels;
}